

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger array_slice(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  _HashNode *p_Var2;
  SQSharedState *ss;
  long lVar3;
  long lVar4;
  SQRESULT SVar5;
  SQObjectValue this;
  char *err;
  long lVar6;
  SQInteger eidx;
  SQInteger sidx;
  SQObjectPtr t;
  SQObjectPtr o;
  long local_78;
  long local_70;
  SQObjectPtr local_68;
  SQObjectPtr local_58;
  HSQUIRRELVM local_48;
  SQObjectPtr local_40;
  
  local_58.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_58.super_SQObject._type = OT_NULL;
  get_slice_params(v,&local_70,&local_78,&local_58);
  p_Var2 = (local_58.super_SQObject._unVal.pTable)->_firstfree;
  if (local_70 < 0) {
    local_70 = (long)&(p_Var2->val).super_SQObject._type + local_70;
  }
  lVar4 = local_70;
  if (local_78 < 0) {
    local_78 = (long)&(p_Var2->val).super_SQObject._type + local_78;
  }
  lVar3 = local_78;
  lVar6 = local_78 - local_70;
  if (local_78 < local_70) {
    err = "wrong indexes";
  }
  else {
    if (local_78 <= (long)p_Var2 && -1 < local_70) {
      ss = v->_sharedstate;
      local_48 = v;
      this.pUserPointer = sq_vm_malloc(0x48);
      SQArray::SQArray(this.pArray,ss,lVar6);
      local_68.super_SQObject._unVal.pTable = (SQTable *)0x0;
      local_68.super_SQObject._type = OT_NULL;
      if (lVar4 < lVar3) {
        lVar6 = 0;
        do {
          SQArray::Get(local_58.super_SQObject._unVal.pArray,lVar4 + lVar6,&local_68);
          SQArray::Set(this.pArray,lVar6,&local_68);
          lVar6 = lVar6 + 1;
        } while ((lVar4 - lVar3) + lVar6 != 0);
      }
      local_40.super_SQObject._type = OT_ARRAY;
      pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_40.super_SQObject._unVal.pUserPointer = this.pUserPointer;
      SQVM::Push(local_48,&local_40);
      SQObjectPtr::~SQObjectPtr(&local_40);
      SQObjectPtr::~SQObjectPtr(&local_68);
      SVar5 = 1;
      goto LAB_0012b113;
    }
    err = "slice out of range";
  }
  SVar5 = sq_throwerror(v,err);
LAB_0012b113:
  SQObjectPtr::~SQObjectPtr(&local_58);
  return SVar5;
}

Assistant:

static SQInteger array_slice(HSQUIRRELVM v)
{
    SQInteger sidx,eidx;
    SQObjectPtr o;
    if(get_slice_params(v,sidx,eidx,o)==-1)return -1;
    SQInteger alen = _array(o)->Size();
    if(sidx < 0)sidx = alen + sidx;
    if(eidx < 0)eidx = alen + eidx;
    if(eidx < sidx)return sq_throwerror(v,_SC("wrong indexes"));
    if(eidx > alen || sidx < 0)return sq_throwerror(v, _SC("slice out of range"));
    SQArray *arr=SQArray::Create(_ss(v),eidx-sidx);
    SQObjectPtr t;
    SQInteger count=0;
    for(SQInteger i=sidx;i<eidx;i++){
        _array(o)->Get(i,t);
        arr->Set(count++,t);
    }
    v->Push(arr);
    return 1;

}